

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

int Abc_NtkDeriveFlatGiaSop(Gia_Man_t *pGia,int *gFanins,char *pSop)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint iLit0;
  uint iLit1;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  
  uVar3 = Abc_SopGetVarNum(pSop);
  iVar4 = Abc_SopIsExorType(pSop);
  if (iVar4 == 0) {
    if (*pSop != '\0') {
      uVar6 = 1;
      pcVar8 = pSop;
LAB_0084a5d6:
      lVar5 = 0;
      iLit0 = 1;
      do {
        bVar2 = pcVar8[lVar5];
        if (bVar2 < 0x31) {
          if (bVar2 == 0x30) {
            if (gFanins[lVar5] < 0) goto LAB_0084a66f;
            iLit1 = gFanins[lVar5] ^ 1;
LAB_0084a600:
            iLit0 = Gia_ManHashAnd(pGia,iLit0,iLit1);
          }
          else if ((bVar2 == 0) || (bVar2 == 0x20)) goto LAB_0084a61a;
        }
        else if (bVar2 == 0x31) {
          iLit1 = gFanins[lVar5];
          goto LAB_0084a600;
        }
        lVar5 = lVar5 + 1;
      } while( true );
    }
  }
  else if (0 < (int)uVar3) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      uVar6 = Gia_ManHashXor(pGia,uVar6,gFanins[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
    goto LAB_0084a64b;
  }
  uVar6 = 0;
  goto LAB_0084a64b;
LAB_0084a61a:
  if (((int)iLit0 < 0) || (uVar6 = Gia_ManHashAnd(pGia,uVar6,iLit0 ^ 1), (int)uVar6 < 0))
  goto LAB_0084a66f;
  pcVar1 = pcVar8 + (int)(uVar3 + 3);
  pcVar8 = pcVar8 + (int)(uVar3 + 3);
  if (*pcVar1 == '\0') goto code_r0x0084a640;
  goto LAB_0084a5d6;
code_r0x0084a640:
  uVar6 = uVar6 ^ 1;
LAB_0084a64b:
  iVar4 = Abc_SopIsComplement(pSop);
  if (iVar4 != 0) {
    if ((int)uVar6 < 0) {
LAB_0084a66f:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    uVar6 = uVar6 ^ 1;
  }
  return uVar6;
}

Assistant:

int Abc_NtkDeriveFlatGiaSop( Gia_Man_t * pGia, int * gFanins, char * pSop )
{
    char * pCube;
    int gAnd, gSum;
    int i, Value, nFanins;
    // get the number of variables
    nFanins = Abc_SopGetVarNum(pSop);
    if ( Abc_SopIsExorType(pSop) )
    {
        gSum = 0; 
        for ( i = 0; i < nFanins; i++ )
            gSum = Gia_ManHashXor( pGia, gSum, gFanins[i] );
    }
    else
    {
        // go through the cubes of the node's SOP
        gSum = 0; 
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            // create the AND of literals
            gAnd = 1;
            Abc_CubeForEachVar( pCube, Value, i )
            {
                if ( Value == '1' )
                    gAnd = Gia_ManHashAnd( pGia, gAnd, gFanins[i] );
                else if ( Value == '0' )
                    gAnd = Gia_ManHashAnd( pGia, gAnd, Abc_LitNot(gFanins[i]) );
            }
            // add to the sum of cubes
            gSum = Gia_ManHashAnd( pGia, Abc_LitNot(gSum), Abc_LitNot(gAnd) );
            gSum = Abc_LitNot( gSum );
        }
    }
    // decide whether to complement the result
    if ( Abc_SopIsComplement(pSop) )
        gSum = Abc_LitNot(gSum);
    return gSum;
}